

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

void __thiscall
kj::anon_unknown_31::HttpInputStreamImpl::~HttpInputStreamImpl(HttpInputStreamImpl *this)

{
  PromiseFulfiller<void> *pPVar1;
  Disposer *pDVar2;
  PromiseNode *pPVar3;
  char *pcVar4;
  size_t sVar5;
  ArrayDisposer *pAVar6;
  
  pPVar1 = (this->onMessageDone).ptr.ptr;
  if (pPVar1 != (PromiseFulfiller<void> *)0x0) {
    (this->onMessageDone).ptr.ptr = (PromiseFulfiller<void> *)0x0;
    pDVar2 = (this->onMessageDone).ptr.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,pPVar1->_vptr_PromiseFulfiller[-2] + (long)&pPVar1->_vptr_PromiseFulfiller);
  }
  pPVar3 = (this->messageReadQueue).super_PromiseBase.node.ptr;
  if (pPVar3 != (PromiseNode *)0x0) {
    (this->messageReadQueue).super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    pDVar2 = (this->messageReadQueue).super_PromiseBase.node.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,pPVar3->_vptr_PromiseNode[-2] + (long)&pPVar3->_vptr_PromiseNode);
  }
  HttpHeaders::~HttpHeaders(&this->headers);
  pcVar4 = (this->headerBuffer).ptr;
  if (pcVar4 != (char *)0x0) {
    sVar5 = (this->headerBuffer).size_;
    (this->headerBuffer).ptr = (char *)0x0;
    (this->headerBuffer).size_ = 0;
    pAVar6 = (this->headerBuffer).disposer;
    (**pAVar6->_vptr_ArrayDisposer)(pAVar6,pcVar4,1,sVar5,sVar5,0);
  }
  return;
}

Assistant:

explicit HttpInputStreamImpl(AsyncInputStream& inner, HttpHeaderTable& table)
      : inner(inner), headerBuffer(kj::heapArray<char>(MIN_BUFFER)), headers(table) {
  }